

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

int OSSL_PARAM_get_double(OSSL_PARAM *p,double *val)

{
  ulong uVar1;
  uint uVar2;
  double *in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  uint64_t u64;
  int64_t i64;
  ulong local_48;
  
  if ((in_RSI != (double *)0x0) && (in_RDI != 0)) {
    if (*(int *)(in_RDI + 8) == 3) {
      if (*(long *)(in_RDI + 0x18) == 8) {
        *in_RSI = **(double **)(in_RDI + 0x10);
        return 1;
      }
    }
    else if (*(int *)(in_RDI + 8) == 2) {
      if (*(long *)(in_RDI + 0x18) == 4) {
        *in_RSI = (double)**(uint **)(in_RDI + 0x10);
        return 1;
      }
      if (*(long *)(in_RDI + 0x18) == 8) {
        uVar1 = **(ulong **)(in_RDI + 0x10);
        uVar2 = real_shift();
        if (uVar1 >> ((byte)uVar2 & 0x3f) == 0) {
          auVar3._8_4_ = (int)(uVar1 >> 0x20);
          auVar3._0_8_ = uVar1;
          auVar3._12_4_ = 0x45300000;
          *in_RSI = (auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          return 1;
        }
      }
    }
    else if (*(int *)(in_RDI + 8) == 1) {
      if (*(long *)(in_RDI + 0x18) == 4) {
        *in_RSI = (double)**(int **)(in_RDI + 0x10);
        return 1;
      }
      if (*(long *)(in_RDI + 0x18) == 8) {
        uVar1 = **(ulong **)(in_RDI + 0x10);
        local_48 = uVar1;
        if ((long)uVar1 < 0) {
          local_48 = -uVar1;
        }
        uVar2 = real_shift();
        if (local_48 >> ((byte)uVar2 & 0x3f) == 0) {
          *in_RSI = (double)(long)uVar1 + 0.0;
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int OSSL_PARAM_get_double(const OSSL_PARAM *p, double *val)
{
    int64_t i64;
    uint64_t u64;

    if (val == NULL || p == NULL)
        return 0;

    if (p->data_type == OSSL_PARAM_REAL) {
        switch (p->data_size) {
        case sizeof(double):
            *val = *(const double *)p->data;
            return 1;
        }
    } else if (p->data_type == OSSL_PARAM_UNSIGNED_INTEGER) {
        switch (p->data_size) {
        case sizeof(uint32_t):
            *val = *(const uint32_t *)p->data;
            return 1;
        case sizeof(uint64_t):
            u64 = *(const uint64_t *)p->data;
            if ((u64 >> real_shift()) == 0) {
                *val = (double)u64;
                return 1;
            }
            break;
        }
    } else if (p->data_type == OSSL_PARAM_INTEGER) {
        switch (p->data_size) {
        case sizeof(int32_t):
            *val = *(const int32_t *)p->data;
            return 1;
        case sizeof(int64_t):
            i64 = *(const int64_t *)p->data;
            u64 = i64 < 0 ? -i64 : i64;
            if ((u64 >> real_shift()) == 0) {
                *val = 0.0 + i64;
                return 1;
            }
            break;
        }
    }
    return 0;
}